

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeTransformMatrix
          (ChElementBeamTaperedTimoshenko *this)

{
  double *pdVar1;
  bool bVar2;
  undefined8 uVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long extraout_RAX;
  undefined8 extraout_RAX_00;
  double *pdVar13;
  char *__function;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar22;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  undefined1 extraout_var [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  ChMatrixNM<double,_6,_6> Ts2;
  ChMatrixNM<double,_6,_6> Ts1;
  ChMatrixNM<double,_12,_12> Ts;
  ChMatrixNM<double,_12,_12> Rotsect;
  ChMatrixNM<double,_12,_12> Tc;
  ChMatrixNM<double,_6,_6> Tc2;
  ChMatrixNM<double,_6,_6> Tc1;
  undefined1 auStack_198e [6];
  undefined1 auStack_1988 [10];
  undefined8 uStack_197e;
  double local_1970;
  ulong uStack_1968;
  Scalar local_1958;
  undefined1 local_1950 [16];
  double local_1940;
  ulong uStack_1938;
  double local_1930 [3];
  ulong uStack_1918;
  double local_1910;
  ulong uStack_1908;
  double local_1900;
  ulong uStack_18f8;
  double local_18f0;
  undefined8 uStack_18e8;
  double local_18d8;
  double local_18d0;
  ulong uStack_18c8;
  double local_18c0;
  ulong uStack_18b8;
  double local_18b0;
  undefined1 auStack_18a8 [8];
  undefined1 local_18a0 [8];
  undefined1 auStack_1898 [8];
  undefined8 local_1890;
  double local_1888;
  undefined8 local_1880;
  double local_1878;
  double local_1870;
  undefined8 local_1868;
  double local_1860;
  double local_1850 [6];
  double local_1820;
  undefined8 local_1818;
  double local_1810;
  undefined1 local_1800 [16];
  double local_17f0;
  ulong uStack_17e8;
  Product<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  local_17e0;
  Matrix<double,_12,_12,_1,_12,_12> *local_17d0;
  undefined1 local_17c8 [32];
  undefined1 local_17a8 [16];
  double local_1798;
  undefined8 local_1790;
  double local_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  double dStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 uStack_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 uStack_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  SrcXprType local_1640;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  double dStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 uStack_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 uStack_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined1 local_1500 [32];
  undefined8 uStack_14e0;
  double local_14d8;
  undefined1 auStack_14c0 [1088];
  Matrix<double,_12,_12,_1,_12,_12> local_1080;
  Matrix<double,_12,_12,_1,_12,_12> local_c00;
  undefined1 local_780 [1152];
  Matrix<double,_6,_6,_1,_6,_6> local_300;
  Matrix<double,_6,_6,_1,_6,_6> local_1c0;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_1950._8_8_ = local_1950._0_8_;
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b2fc;
  local_1970 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x30))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b30f;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b340;
  local_1940 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x38))();
  uStack_1938 = extraout_XMM0_Qb;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b353;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b384;
  local_1900 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x40))();
  uStack_18f8 = extraout_XMM0_Qb_00;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b39a;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b3cb;
  local_1930[1] =
       (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler + 0x48))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b3de;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b40f;
  local_18c0 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x50))();
  uStack_18b8 = extraout_XMM0_Qb_01;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b425;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b456;
  local_1950._0_8_ =
       (**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler +
                   0x30))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b469;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b49a;
  local_1910 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x38))();
  uStack_1908 = extraout_XMM0_Qb_02;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b4ad;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b4de;
  local_1930[2] =
       (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler + 0x40))();
  uStack_1918 = extraout_XMM0_Qb_03;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b4f1;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b522;
  local_1930[0] =
       (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler + 0x48))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b535;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  auStack_1988._0_8_ = 0x66b566;
  local_18d0 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x50))();
  uStack_18c8 = extraout_XMM0_Qb_04;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auStack_1988._0_8_ = 0x66b57c;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  local_18b0 = (this->super_ChElementBeam).length;
  auStack_18a8 = (undefined1  [8])0x0;
  auStack_1988._0_8_ = 0x66b595;
  local_18f0 = cos(local_1970);
  auStack_1988._0_8_ = 0x66b5a9;
  auVar21._0_8_ = sin(local_1970);
  auVar21._8_56_ = extraout_var;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_18f0;
  local_1850[0] = 1.0;
  local_1850[1] = 0.0;
  local_1820 = auVar21._0_8_ * 0.0;
  dVar22 = local_18f0 * 0.0;
  local_1850[2] = -0.0;
  local_1850[3] = local_1820 - dVar22;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_1820;
  auVar29 = vfmadd213sd_fma(ZEXT816(0),auVar29,auVar48);
  local_1820 = dVar22 + local_1820;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar22;
  auVar38 = vfmsub213sd_fma(auVar38,ZEXT816(0) << 0x40,auVar21._0_16_);
  local_1850[4] = auVar29._0_8_;
  local_1818 = auVar38._0_8_;
  local_1810 = local_18f0;
  auStack_1988._0_8_ = 0x66b638;
  local_1850[5] = auVar21._0_8_;
  local_1970 = cos((double)local_1950._0_8_);
  auStack_1988._0_8_ = 0x66b649;
  auVar26._0_8_ = sin((double)local_1950._0_8_);
  auVar26._8_56_ = extraout_var_00;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_1970;
  local_18a0 = (undefined1  [8])0x3ff0000000000000;
  auStack_1898 = (undefined1  [8])0x0;
  dVar22 = auVar26._0_8_ * 0.0;
  local_1870 = local_1970 * 0.0;
  local_1890 = 0x8000000000000000;
  lVar16 = 0;
  local_1888 = dVar22 - local_1870;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_1870;
  auVar38 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar39,auVar26._0_16_);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar22;
  auVar29 = vfmadd213sd_fma(ZEXT816(0),auVar30,auVar49);
  local_1870 = local_1870 + dVar22;
  local_1880 = auVar29._0_8_;
  local_1868 = auVar38._0_8_;
  local_1860 = local_1970;
  auStack_1988._0_8_ = 0x66b6db;
  local_1878 = auVar26._0_8_;
  memset(&local_c00,0,0x480);
  do {
    uVar9 = *(undefined8 *)((long)local_1850 + lVar16 + 8);
    uVar3 = *(undefined8 *)((long)local_1850 + lVar16 + 0x10);
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4) = *(undefined8 *)((long)local_1850 + lVar16);
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4 + 8) = uVar9;
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4 + 0x10) = uVar3;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x48);
  lVar16 = 0x52;
  do {
    uVar9 = *(undefined8 *)(local_18a0 + lVar16 + 6);
    uVar3 = *(undefined8 *)(auStack_1898 + lVar16 + 6);
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4 + -0x10) = *(undefined8 *)(auStack_18a8 + lVar16 + 6);
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4 + -8) = uVar9;
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4) = uVar3;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x9a);
  lVar16 = 0xa0;
  do {
    uVar9 = *(undefined8 *)((long)&uStack_1938 + lVar16);
    uVar3 = *(undefined8 *)((long)local_1930 + lVar16);
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4 + -0x10) = *(undefined8 *)((long)&local_1940 + lVar16);
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4 + -8) = uVar9;
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4) = uVar3;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0xe8);
  lVar16 = 0xee;
  do {
    uVar9 = *(undefined8 *)(auStack_1988 + lVar16 + 2);
    uVar3 = *(undefined8 *)((long)&uStack_197e + lVar16);
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4 + -0x10) = *(undefined8 *)(auStack_198e + lVar16);
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4 + -8) = uVar9;
    *(undefined8 *)
     ((long)local_c00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar16 * 4) = uVar3;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x136);
  local_17f0 = local_1910 - local_1940;
  local_18f0 = local_1930[2] - local_1900;
  auVar10._8_8_ = auStack_18a8;
  auVar10._0_8_ = local_18b0;
  uStack_17e8 = 0;
  local_18d8 = local_17f0 * local_17f0;
  local_1800._8_8_ = 0;
  local_1800._0_8_ = local_18f0;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_18d8;
  auVar29 = vfmsub213sd_fma(auVar10,auVar10,auVar40);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_18f0;
  auVar29 = vfnmadd231sd_fma(auVar29,local_1800,auVar31);
  local_1970 = -0.0;
  uStack_1968 = 0x8000000000000000;
  local_18f0 = -local_18f0;
  uStack_18e8 = 0x8000000000000000;
  auStack_1988._0_8_ = 0x66b815;
  auVar27._0_8_ = pow(auVar29._0_8_,0.5);
  auVar27._8_56_ = extraout_var_01;
  local_1950 = auVar27._0_16_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_18d8;
  auVar29 = vfmadd231sd_fma(auVar23,local_1950,local_1950);
  auStack_1988._0_8_ = 0x66b83a;
  auVar28._0_8_ = pow(auVar29._0_8_,0.5);
  auVar28._8_56_ = extraout_var_02;
  auVar11._8_8_ = auStack_18a8;
  auVar11._0_8_ = local_18b0;
  auVar12._8_8_ = uStack_17e8;
  auVar12._0_8_ = local_17f0;
  auVar45._0_8_ = (double)((ulong)local_17f0 ^ (ulong)local_1970);
  auVar45._8_8_ = uStack_17e8 ^ uStack_1968;
  auVar29 = vunpcklpd_avx(local_1950,auVar12);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (double)local_1800._0_8_ * local_1950._0_8_;
  auVar38 = vunpcklpd_avx(auVar32,auVar45);
  auVar18._16_16_ = auVar38;
  auVar18._0_16_ = auVar29;
  auVar29 = vunpcklpd_avx(auVar11,auVar28._0_16_);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_18b0 * auVar28._0_8_;
  auVar20._16_8_ = local_18b0 * auVar28._0_8_;
  auVar20._0_16_ = auVar29;
  auVar20._24_8_ = 0;
  auVar29 = vunpcklpd_avx(auVar28._0_16_,auVar41);
  auVar20 = vpermpd_avx2(auVar20,0x24);
  local_17c8 = vdivpd_avx(auVar18,auVar20);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (double)local_1800._0_8_ * auVar45._0_8_;
  auVar38 = vunpcklpd_avx(local_1950,auVar33);
  local_17a8 = vdivpd_avx(auVar38,auVar29);
  local_1798 = local_18f0 / local_18b0;
  local_1790 = 0;
  local_1788 = auVar28._0_8_ / local_18b0;
  lVar16 = extraout_RAX;
  if (this->use_Rc == true) {
    if (((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows < 3) ||
       (lVar16 = (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar16 < 3)) {
LAB_0066c0c0:
      auStack_1988._0_8_ = 0x66c0e2;
      __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
                   );
    }
    lVar14 = 0x10;
    pdVar13 = (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data + 2;
    do {
      dVar22 = *(double *)(local_17c8 + lVar14 + -8);
      pdVar13[-2] = *(double *)((long)&local_17e0.m_rhs + lVar14);
      pdVar13[-1] = dVar22;
      pdVar1 = (double *)(local_17c8 + lVar14);
      lVar14 = lVar14 + 0x18;
      *pdVar13 = *pdVar1;
      pdVar13 = pdVar13 + lVar16;
    } while (lVar14 != 0x58);
    if (((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows < 6) ||
       (lVar14 = (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar14 < 6)) goto LAB_0066c0c0;
    lVar16 = lVar14 * 8;
    lVar15 = 0x10;
    pdVar13 = (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data + lVar14 * 3 + 5;
    do {
      dVar22 = *(double *)(local_17c8 + lVar15 + -8);
      pdVar13[-2] = *(double *)((long)&local_17e0.m_rhs + lVar15);
      pdVar13[-1] = dVar22;
      pdVar1 = (double *)(local_17c8 + lVar15);
      lVar15 = lVar15 + 0x18;
      *pdVar13 = *pdVar1;
      pdVar13 = pdVar13 + lVar14;
    } while (lVar15 != 0x58);
  }
  auVar21 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
  uVar17 = CONCAT71((int7)((ulong)lVar16 >> 8),0x3f) & 0xffffffff;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x15] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xe]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[3] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[6] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[7] =
       0.0;
  vscatterqpd_avx512f(ZEXT864(&local_1c0) + _DAT_00974f40,uVar17,auVar21);
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x15] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8] =
       0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xe]
       = 0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1] =
       0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2] =
       0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[3] =
       0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[6] =
       0.0;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[7] =
       0.0;
  auVar34._0_8_ = (ulong)local_1940 ^ (ulong)local_1970;
  auVar34._8_8_ = uStack_1938 ^ uStack_1968;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4] =
       local_1900;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx(auVar34);
  auVar35._0_8_ = (ulong)local_1900 ^ (ulong)local_1970;
  auVar35._8_8_ = uStack_18f8 ^ uStack_1968;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9] =
       (double)vmovlpd_avx(auVar35);
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xf]
       = local_1940;
  vscatterqpd_avx512f(ZEXT864(&local_300) + _DAT_00974f40,uVar17,auVar21);
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4] =
       local_1930[2];
  auVar24._0_8_ = (ulong)local_1910 ^ (ulong)local_1970;
  auVar24._8_8_ = uStack_1908 ^ uStack_1968;
  auVar42._0_8_ = (ulong)local_1930[2] ^ (ulong)local_1970;
  auVar42._8_8_ = uStack_1918 ^ uStack_1968;
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx(auVar24);
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9] =
       (double)vmovlpd_avx(auVar42);
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xf]
       = local_1910;
  auStack_1988._0_8_ = 0x66baae;
  memset((XprTypeNested)local_780,0,0x480);
  auVar47._8_8_ = 0x3ff0000000000000;
  auVar47._0_8_ = 0x3ff0000000000000;
  auVar47._16_8_ = 0x3ff0000000000000;
  auVar47._24_8_ = 0x3ff0000000000000;
  auVar20 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  lVar16 = 0xc;
  auVar18 = vpbroadcastq_avx512vl();
  do {
    auVar46._8_8_ = 0x60;
    auVar46._0_8_ = 0x60;
    auVar46._16_8_ = 0x60;
    auVar46._24_8_ = 0x60;
    auVar19 = vpmullq_avx512vl(auVar20,auVar46);
    auVar46 = vpsllq_avx2(auVar20,3);
    auVar7._8_8_ = 0xc;
    auVar7._0_8_ = 0xc;
    auVar7._16_8_ = 0xc;
    auVar7._24_8_ = 0xc;
    uVar17 = vpcmpuq_avx512vl(auVar20,auVar7,1);
    auVar8._8_8_ = 4;
    auVar8._0_8_ = 4;
    auVar8._16_8_ = 4;
    auVar8._24_8_ = 4;
    auVar20 = vpaddq_avx512vl(auVar20,auVar8);
    lVar16 = lVar16 + -4;
    auVar46 = vpaddq_avx2(auVar18,auVar46);
    auVar46 = vpaddq_avx2(auVar46,auVar19);
    vscatterqpd_avx512vl(ZEXT832(0) + auVar46,uVar17 & 0xf,auVar47);
  } while (lVar16 != 0);
  if ((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      == 6) {
    stack0xffffffffffffeb18 = (undefined1  [16])0x0;
    local_14d8 = 5.92878775009496e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[1] = 0.0;
    auStack_1988._0_8_ = 0x66bb71;
    local_1640.m_lhs = &local_1c0;
    local_1640.m_rhs = &this->Rc;
    local_1500._0_8_ = (XprTypeNested)local_780;
    local_1500._16_8_ = (XprTypeNested)local_780;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>,_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_6,__1,_0,_6,__1> *)&local_1080,&local_1640,
          (assign_op<double,_double> *)&local_1780);
    auStack_1988._0_8_ = 0x66bb8e;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,_1,0,6,_1>,Eigen::internal::assign_op<double,double>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_1500,
               (Matrix<double,_6,__1,_0,_6,__1> *)&local_1080,
               (assign_op<double,_double> *)&local_1780);
    if ((double *)
        local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[0] != (double *)0x0) {
      auStack_1988._0_8_ = 0x66bba4;
      free(*(void **)((long)local_1080.
                            super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                            m_storage.m_data.array[0] + 0xfffffffffffffff8));
    }
    if ((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        == 6) {
      local_1500._0_8_ = local_780 + 0x270;
      local_1500._16_8_ = local_780;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[0] = 0.0;
      local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[1] = 0.0;
      uStack_14e0 = 6;
      local_1500._24_8_ = 6;
      local_14d8 = 5.92878775009496e-323;
      auStack_1988._0_8_ = 0x66bc23;
      local_1640.m_lhs = &local_300;
      local_1640.m_rhs = &this->Rc;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>,_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_6,__1,_0,_6,__1> *)&local_1080,&local_1640,
            (assign_op<double,_double> *)&local_1780);
      auStack_1988._0_8_ = 0x66bc46;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,_1,0,6,_1>,Eigen::internal::assign_op<double,double>>
                ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_1500,
                 (Matrix<double,_6,__1,_0,_6,__1> *)&local_1080,
                 (assign_op<double,_double> *)&local_1780);
      if ((double *)
          local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[0] != (double *)0x0) {
        auStack_1988._0_8_ = 0x66bc5c;
        free(*(void **)((long)local_1080.
                              super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                              m_storage.m_data.array[0] + 0xfffffffffffffff8));
      }
      local_1930[2] = local_1930[1] - local_1930[0];
      local_1940 = local_18c0 - local_18d0;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_1930[2] * local_1930[2];
      auVar29 = vfmadd231sd_fma(auVar43,local_1950,local_1950);
      local_1900 = auVar29._0_8_;
      auStack_1988._0_8_ = 0x66bcaf;
      local_1910 = pow(local_1900,0.5);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_1940;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_1900;
      auVar29 = vfmadd231sd_fma(auVar36,auVar25,auVar25);
      auStack_1988._0_8_ = 0x66bcda;
      dVar22 = pow(auVar29._0_8_,0.5);
      auVar21 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      bVar2 = this->use_simplified_correction_for_inclined_shear_axis;
      uVar17 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),0x3f) & 0xffffffff;
      uStack_1540 = 0;
      uStack_1538 = 0;
      uStack_1530 = 0;
      uStack_1528 = 0;
      uStack_1580 = 0;
      uStack_1578 = 0;
      uStack_1570 = 0;
      uStack_1568 = 0;
      local_1560 = 0;
      uStack_1558 = 0;
      uStack_1550 = 0;
      uStack_1548 = 0;
      local_15c0 = 0;
      uStack_15b8 = 0;
      uStack_15b0 = 0;
      uStack_15a8 = 0;
      uStack_15a0 = 0;
      uStack_1598 = 0;
      uStack_1590 = 0;
      uStack_1588 = 0;
      local_1600 = 0;
      uStack_15f0 = 0;
      uStack_15e8 = 0;
      uStack_15e0 = 0;
      uStack_15d8 = 0;
      uStack_15d0 = 0;
      local_1640.m_lhs = (Matrix<double,_6,_6,_1,_6,_6> *)0x0;
      local_1640.m_rhs = (ChMatrixDynamic<> *)0x0;
      uStack_1630 = 0;
      uStack_1628 = 0;
      uStack_1620 = 0;
      uStack_1618 = 0;
      uStack_1610 = 0;
      uStack_1608 = 0;
      vscatterqpd_avx512f(ZEXT864(&local_1640) + ZEXT864(0) + _DAT_00974f40,uVar17,auVar21);
      uStack_1680 = 0;
      uStack_1678 = 0;
      uStack_1670 = 0;
      uStack_1668 = 0;
      uStack_16c0 = 0;
      uStack_16b8 = 0;
      uStack_16b0 = 0;
      uStack_16a8 = 0;
      local_16a0 = 0;
      uStack_1698 = 0;
      uStack_1690 = 0;
      uStack_1688 = 0;
      local_1700 = 0;
      uStack_16f8 = 0;
      uStack_16f0 = 0;
      uStack_16e8 = 0;
      uStack_16e0 = 0;
      uStack_16d8 = 0;
      uStack_16d0 = 0;
      uStack_16c8 = 0;
      local_1740 = 0;
      uStack_1730 = 0;
      uStack_1728 = 0;
      uStack_1720 = 0;
      uStack_1718 = 0;
      uStack_1710 = 0;
      local_1780 = 0;
      uStack_1778 = 0;
      uStack_1770 = 0;
      uStack_1768 = 0;
      uStack_1760 = 0;
      uStack_1758 = 0;
      uStack_1750 = 0;
      uStack_1748 = 0;
      auVar44._0_8_ = (ulong)local_1970 ^ (ulong)local_18c0;
      auVar44._8_8_ = uStack_1968 ^ uStack_18b8;
      uStack_15f8 = vmovlpd_avx(auVar44);
      dStack_15c8 = local_1930[1];
      vscatterqpd_avx512f(ZEXT864((assign_op<double,_double> *)&local_1780) + _DAT_00974f40,uVar17,
                          auVar21);
      auVar37._0_8_ = (ulong)local_1970 ^ (ulong)local_18d0;
      auVar37._8_8_ = uStack_1968 ^ uStack_18c8;
      uStack_1738 = vmovlpd_avx(auVar37);
      dStack_1708 = local_1930[0];
      if (this->use_Rs == true) {
        uVar17 = (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows;
        if (((long)uVar17 < 4) ||
           (lVar16 = (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar16 < 4)) {
LAB_0066c07c:
          auStack_1988._0_8_ = 0x66c09e;
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                       );
        }
        pdVar13 = (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        pdVar13[lVar16 * 3 + 3] = dVar22 / (double)local_1950._0_8_;
        if ((uVar17 == 4) ||
           (pdVar13[lVar16 * 4 + 3] =
                 (double)((ulong)(bVar2 & 1) * (long)(local_1930[2] / (double)local_1950._0_8_) +
                         (ulong)!(bool)(bVar2 & 1) *
                         (long)((local_1930[2] * dVar22) / ((double)local_1950._0_8_ * local_1910)))
           , uVar17 < 6)) goto LAB_0066c07c;
        pdVar13[lVar16 * 5 + 3] =
             local_1940 /
             (double)((ulong)(bVar2 & 1) * local_1950._0_8_ +
                     (ulong)!(bool)(bVar2 & 1) * (long)local_1910);
      }
      auStack_1988._0_8_ = 0x66be6b;
      memset(&local_1080,0,0x480);
      auVar51._8_8_ = 0x3ff0000000000000;
      auVar51._0_8_ = 0x3ff0000000000000;
      auVar51._16_8_ = 0x3ff0000000000000;
      auVar51._24_8_ = 0x3ff0000000000000;
      auVar20 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar19._8_8_ = 0xc;
      auVar19._0_8_ = 0xc;
      auVar19._16_8_ = 0xc;
      auVar19._24_8_ = 0xc;
      auVar50._8_8_ = 0x60;
      auVar50._0_8_ = 0x60;
      auVar50._16_8_ = 0x60;
      auVar50._24_8_ = 0x60;
      auVar52._8_8_ = 4;
      auVar52._0_8_ = 4;
      auVar52._16_8_ = 4;
      auVar52._24_8_ = 4;
      lVar16 = 0xc;
      auVar18 = vpbroadcastq_avx512vl();
      do {
        auVar46 = vpmullq_avx512vl(auVar20,auVar50);
        auVar47 = vpsllq_avx2(auVar20,3);
        uVar17 = vpcmpuq_avx512vl(auVar20,auVar19,1);
        auVar20 = vpaddq_avx2(auVar20,auVar52);
        lVar16 = lVar16 + -4;
        auVar47 = vpaddq_avx2(auVar18,auVar47);
        auVar47 = vpaddq_avx2(auVar47,auVar46);
        vscatterqpd_avx512vl(ZEXT832(0) + auVar47,uVar17 & 0xf,auVar51);
      } while (lVar16 != 0);
      if ((this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols == 6) {
        stack0xffffffffffffeb18 = (undefined1  [16])0x0;
        local_14d8 = 5.92878775009496e-323;
        auStack_1988._0_8_ = 0x66bf28;
        local_17e0.m_lhs = (LhsNested)&this->Rs;
        local_17e0.m_rhs = (RhsNested)&local_1640;
        local_1500._0_8_ = &local_1080;
        local_1500._16_8_ = &local_1080;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::internal::assign_op<double,double>>
                  ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_1500,
                   (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                    *)&local_17e0,(assign_op<double,_double> *)&local_1958,(type)0x0);
        if ((this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols == 6) {
          local_1500._0_8_ = *(undefined1 (*) [16])&local_1080 + 0x270;
          uStack_14e0 = 6;
          local_1500._24_8_ = 6;
          local_14d8 = 5.92878775009496e-323;
          auStack_1988._0_8_ = 0x66bf81;
          local_17e0.m_lhs = (LhsNested)&this->Rs;
          local_17e0.m_rhs = (RhsNested)&local_1780;
          local_1500._16_8_ = &local_1080;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::internal::assign_op<double,double>>
                    ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_1500,
                     (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                      *)&local_17e0,(assign_op<double,_double> *)&local_1958,(type)0x0);
          local_17e0.m_lhs = &local_c00;
          auStack_1988._0_8_ = 0x66bfbb;
          local_17e0.m_rhs = &local_1080;
          local_17d0 = (Matrix<double,_12,_12,_1,_12,_12> *)local_780;
          memset((Matrix<double,_12,_12,_1,_12,_12> *)local_1500,0,0x480);
          local_1958 = 1.0;
          auStack_1988._0_8_ = 0x66bfe5;
          Eigen::internal::
          generic_product_impl<Eigen::Product<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
                    ((Matrix<double,_12,_12,_1,_12,_12> *)local_1500,&local_17e0,
                     (Matrix<double,_12,_12,_1,_12,_12> *)local_780,&local_1958);
          if (((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_rows != 0xc) ||
             ((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols != 0xc)) {
            auStack_1988._0_8_ = 0x66c010;
            Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                      ((DenseStorage<double,__1,__1,__1,_1> *)&this->T,0x90,0xc,0xc);
            if (((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows != 0xc) ||
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_cols != 0xc)) {
              auStack_1988._0_8_ = &LAB_0066c101;
              __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                            "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, 12, 12, 1>, T1 = double, T2 = double]"
                           );
            }
          }
          pdVar13 = (this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_data;
          uVar17 = 0xfffffffffffffff8;
          do {
            auVar21 = vmovdqa64_avx512f(*(undefined1 (*) [64])(auStack_14c0 + uVar17 * 8));
            auVar21 = vmovdqa64_avx512f(auVar21);
            *(undefined1 (*) [64])(pdVar13 + uVar17 + 8) = auVar21;
            uVar17 = uVar17 + 8;
          } while (uVar17 < 0x88);
          return;
        }
      }
      __function = 
      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 6, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 6, 6, 1>, Option = 0]"
      ;
      goto LAB_0066c0b3;
    }
  }
  __function = 
  "Eigen::Product<Eigen::Matrix<double, 6, 6, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 6, 6, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
  ;
LAB_0066c0b3:
  auStack_1988._0_8_ = 0x66c0c0;
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeTransformMatrix() {
    double alpha1 = this->tapered_section->GetSectionA()->GetSectionRotation();
    double Cy1 = this->tapered_section->GetSectionA()->GetCentroidY();
    double Cz1 = this->tapered_section->GetSectionA()->GetCentroidZ();
    double Sy1 = this->tapered_section->GetSectionA()->GetShearCenterY();
    double Sz1 = this->tapered_section->GetSectionA()->GetShearCenterZ();

    double alpha2 = this->tapered_section->GetSectionB()->GetSectionRotation();
    double Cy2 = this->tapered_section->GetSectionB()->GetCentroidY();
    double Cz2 = this->tapered_section->GetSectionB()->GetCentroidZ();
    double Sy2 = this->tapered_section->GetSectionB()->GetShearCenterY();
    double Sz2 = this->tapered_section->GetSectionB()->GetShearCenterZ();

    double L = this->length;

    // In case the section is rotated:
    ChMatrix33<> RotsectA;
    RotsectA.Set_A_Rxyz(ChVector<>(alpha1, 0, 0));
    ChMatrix33<> RotsectB;
    RotsectB.Set_A_Rxyz(ChVector<>(alpha2, 0, 0));
    ChMatrixNM<double, 12, 12> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = RotsectA;
    Rotsect.block<3, 3>(3, 3) = RotsectA;
    Rotsect.block<3, 3>(6, 6) = RotsectB;
    Rotsect.block<3, 3>(9, 9) = RotsectB;

    // In case the section has a centroid displacement:
    // double dCx = 0;
    double dCy = Cy2 - Cy1;
    double dCz = Cz2 - Cz1;
    double LN = L;
    double LG = pow(LN * LN - dCy * dCy - dCz * dCz, 0.5);
    double LA = LG;
    double LB = pow(LG * LG + dCy * dCy, 0.5);
    ChMatrix33<> rc;
    rc.setIdentity();
    rc(0, 0) = LA / LN;
    rc(0, 1) = dCy / LB;
    rc(0, 2) = LA * dCz / (LN * LB);
    rc(1, 0) = -dCy / LN;
    rc(1, 1) = LA / LB;
    rc(1, 2) = -dCy * dCz / (LN * LB);
    rc(2, 0) = -dCz / LN;
    rc(2, 1) = 0.0;
    rc(2, 2) = LB / LN;
    // ChMatrixNM<double, 6, 6> Rc;
    // Rc.setIdentity();
    if (use_Rc) {
        this->Rc.block<3, 3>(0, 0) = rc;
        this->Rc.block<3, 3>(3, 3) = rc;
    }

    ChMatrixNM<double, 6, 6> Tc1;
    Tc1.setIdentity();
    Tc1(0, 4) = Cz1;
    Tc1(0, 5) = -Cy1;
    Tc1(1, 3) = -Cz1;
    Tc1(2, 3) = Cy1;

    ChMatrixNM<double, 6, 6> Tc2;
    Tc2.setIdentity();
    Tc2(0, 4) = Cz2;
    Tc2(0, 5) = -Cy2;
    Tc2(1, 3) = -Cz2;
    Tc2(2, 3) = Cy2;

    ChMatrixNM<double, 12, 12> Tc;
    Tc.setIdentity();
    Tc.block<6, 6>(0, 0) = Tc1 * Rc;
    Tc.block<6, 6>(6, 6) = Tc2 * Rc;

    // In case the section has a shear center displacement:
    // The shear center offset is respect to the centerline of beam element.
    /*Sy1 = Sy1 - Cy1;  // Unnecessary to do this substraction
    Sz1 = Sz1 - Cz1;
    Sy2 = Sy2 - Cy2;
    Sz2 = Sz2 - Cz2;*/
    double dSy = Sy1 - Sy2;
    double dSz = Sz1 - Sz2;

    double Lsy = pow(LG * LG + dSy * dSy, 0.5);
    double Lsyz = pow(LG * LG + dSy * dSy + dSz * dSz, 0.5);
    double C1 = Lsyz / LG;
    double C2 = dSy * Lsyz / (LG * Lsy);
    double C3 = dSz / Lsy;
    if (this->use_simplified_correction_for_inclined_shear_axis) {
        C1 = Lsyz / LG;
        C2 = dSy / LG;
        C3 = dSz / LG;
    }

    ChMatrixNM<double, 6, 6> Ts1;
    Ts1.setIdentity();
    Ts1(1, 3) = -Sz1;
    Ts1(2, 3) = Sy1;

    ChMatrixNM<double, 6, 6> Ts2;
    Ts2.setIdentity();
    Ts2(1, 3) = -Sz2;
    Ts2(2, 3) = Sy2;

    // ChMatrixNM<double, 6, 6> Rs;
    // Rs.setIdentity();
    if (use_Rs) {
        this->Rs(3, 3) = C1;
        this->Rs(4, 3) = C2;
        this->Rs(5, 3) = C3;
    }

    ChMatrixNM<double, 12, 12> Ts;
    Ts.setIdentity();
    Ts.block<6, 6>(0, 0) = Rs * Ts1;
    Ts.block<6, 6>(6, 6) = Rs * Ts2;

    this->T = Rotsect * Ts * Tc;
}